

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pointlight.cpp
# Opt level: O2

void __thiscall PointLight::PointLight(PointLight *this,vec3 *p,ColorRGB c)

{
  *(undefined8 *)&(this->position).field_0 = 0;
  (this->position).field_0.field_0.z = 0.0;
  ColorRGB::ColorRGB(&this->color);
  (this->position).field_0.field_0.x = (p->field_0).field_0.x;
  (this->position).field_0.field_0.y = (p->field_0).field_0.y;
  (this->position).field_0.field_0.z = (p->field_0).field_0.z;
  (this->color).r = (float)(int)c._0_8_;
  (this->color).g = (float)(int)((ulong)c._0_8_ >> 0x20);
  (this->color).b = c.b;
  return;
}

Assistant:

PointLight::PointLight(glm::vec3 p, ColorRGB c) {
    position = p;
    color = c;
}